

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
embree::ImageT<embree::Col3<unsigned_char>_>::set
          (ImageT<embree::Col3<unsigned_char>_> *this,size_t x,size_t y,Color4 *c)

{
  Col3<unsigned_char> *pCVar1;
  undefined1 auVar2 [16];
  undefined1 local_298 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  Color4 *c_local;
  size_t y_local;
  size_t x_local;
  ImageT<embree::Col3<unsigned_char>_> *this_local;
  vfloat4 s;
  
  pCVar1 = this->data + y * (this->super_Image).width + x;
  auVar2._8_8_ = 0x3f8000003f800000;
  auVar2._0_8_ = 0x3f8000003f800000;
  auVar2 = minps((undefined1  [16])c->field_0,auVar2);
  auVar2 = maxps(auVar2,local_298);
  local_148 = auVar2._0_4_;
  fStack_144 = auVar2._4_4_;
  fStack_140 = auVar2._8_4_;
  pCVar1->r = (uchar)(int)(local_148 * 255.0);
  pCVar1->g = (uchar)(int)(fStack_144 * 255.0);
  pCVar1->b = (uchar)(int)(fStack_140 * 255.0);
  return;
}

Assistant:

__forceinline void set(size_t x, size_t y, const Color4& c) { 
      c.set(data[y*width+x]); 
    }